

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O0

void __thiscall
AS_02::TimedText::Type5UUIDFilenameResolver::Type5UUIDFilenameResolver
          (Type5UUIDFilenameResolver *this)

{
  Type5UUIDFilenameResolver *this_local;
  
  ASDCP::TimedText::IResourceResolver::IResourceResolver(&this->super_IResourceResolver);
  (this->super_IResourceResolver)._vptr_IResourceResolver =
       (_func_int **)&PTR__Type5UUIDFilenameResolver_001ef658;
  std::
  map<Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_ResourceMap);
  std::__cxx11::string::string((string *)&this->m_Dirname);
  return;
}

Assistant:

AS_02::TimedText::Type5UUIDFilenameResolver::Type5UUIDFilenameResolver() {}